

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall despot::VNode::PrintTree(VNode *this,int depth,ostream *os)

{
  pointer this_00;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *this_01;
  size_type sVar4;
  reference ppQVar5;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *this_02;
  pointer __x;
  ulong uVar6;
  reference pvVar7;
  VNode *this_03;
  double dVar8;
  ValuedAction VVar9;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  int local_d8;
  allocator<char> local_d1;
  int i;
  string local_b0;
  _Base_ptr local_90;
  _Self local_88;
  _Self local_80;
  iterator it;
  map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
  *vnodes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> labels;
  QNode *qnode;
  int a;
  vector<despot::QNode_*,_std::allocator<despot::QNode_*>_> *qnodes;
  ostream *os_local;
  int depth_local;
  VNode *this_local;
  
  if ((depth == -1) || (iVar2 = VNode::depth(this), iVar2 <= depth)) {
    iVar2 = VNode::depth(this);
    if (iVar2 == 0) {
      poVar3 = std::operator<<(os,"d - default value");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"l - lower bound");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"u - upper bound");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"r - totol weighted one step reward");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = std::operator<<(poVar3,"w - total particle weight");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    poVar3 = std::operator<<(os,"(");
    poVar3 = std::operator<<(poVar3,"d:");
    VVar9 = default_move(this);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,VVar9.value);
    poVar3 = std::operator<<(poVar3," l:");
    dVar8 = lower_bound(this);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar8);
    poVar3 = std::operator<<(poVar3,", u:");
    dVar8 = upper_bound(this);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar8);
    poVar3 = std::operator<<(poVar3,", w:");
    dVar8 = Weight(this);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar8);
    poVar3 = std::operator<<(poVar3,", weu:");
    dVar8 = DESPOT::WEU(this);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar8);
    poVar3 = std::operator<<(poVar3,")");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_01 = children(this);
    for (qnode._4_4_ = 0;
        sVar4 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::size(this_01),
        (ulong)(long)qnode._4_4_ < sVar4; qnode._4_4_ = qnode._4_4_ + 1) {
      ppQVar5 = std::vector<despot::QNode_*,_std::allocator<despot::QNode_*>_>::operator[]
                          (this_01,(long)qnode._4_4_);
      labels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*ppQVar5;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&vnodes);
      this_02 = QNode::children((QNode *)labels.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_80._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
           ::begin(this_02);
      while( true ) {
        local_88._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_despot::VNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_despot::VNode_*>_>_>
             ::end(this_02);
        bVar1 = std::operator!=(&local_80,&local_88);
        if (!bVar1) break;
        __x = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::operator->
                        (&local_80);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&vnodes,&__x->first);
        local_90 = (_Base_ptr)
                   std::_Rb_tree_iterator<std::pair<const_unsigned_long,_despot::VNode_*>_>::
                   operator++(&local_80,0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&i,"|   ",&local_d1);
      iVar2 = VNode::depth(this);
      repeat(&local_b0,(string *)&i,iVar2);
      poVar3 = std::operator<<(os,(string *)&local_b0);
      poVar3 = std::operator<<(poVar3,"a=");
      iVar2 = QNode::edge((QNode *)labels.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = std::operator<<(poVar3,"(d:");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,(double)labels.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage[0xc]);
      poVar3 = std::operator<<(poVar3,", l:");
      dVar8 = QNode::lower_bound((QNode *)labels.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar8);
      poVar3 = std::operator<<(poVar3,", u:");
      dVar8 = QNode::upper_bound((QNode *)labels.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar8);
      poVar3 = std::operator<<(poVar3,", r:");
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (poVar3,(double)labels.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage[0xe]);
      poVar3 = std::operator<<(poVar3,")");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator(&local_d1);
      for (local_d8 = 0; uVar6 = (ulong)local_d8,
          sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&vnodes),
          uVar6 < sVar4; local_d8 = local_d8 + 1) {
        if ((depth == -1) || (iVar2 = VNode::depth(this), iVar2 + 1 <= depth)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"|   ",&local_119)
          ;
          iVar2 = VNode::depth(this);
          repeat(&local_f8,&local_118,iVar2);
          poVar3 = std::operator<<(os,(string *)&local_f8);
          poVar3 = std::operator<<(poVar3,"| o=");
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&vnodes,
                              (long)local_d8);
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar7);
          std::operator<<(poVar3,": ");
          std::__cxx11::string::~string((string *)&local_f8);
          std::__cxx11::string::~string((string *)&local_118);
          std::allocator<char>::~allocator(&local_119);
          this_00 = labels.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage;
          pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                             ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&vnodes,
                              (long)local_d8);
          this_03 = QNode::Child((QNode *)this_00,*pvVar7);
          PrintTree(this_03,depth,os);
        }
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&vnodes);
    }
  }
  return;
}

Assistant:

void VNode::PrintTree(int depth, ostream& os) {
	if (depth != -1 && this->depth() > depth)
		return;

	if (this->depth() == 0) {
		os << "d - default value" << endl
			<< "l - lower bound" << endl
			<< "u - upper bound" << endl
			<< "r - totol weighted one step reward" << endl
			<< "w - total particle weight" << endl;
	}

	os << "(" << "d:" << this->default_move().value <<
		" l:" << this->lower_bound() << ", u:" << this->upper_bound()
		<< ", w:" << this->Weight() << ", weu:" << DESPOT::WEU(this)
		<< ")"
		<< endl;


	vector<QNode*>& qnodes = children();
	for (int a = 0; a < qnodes.size(); a++) {
		QNode* qnode = qnodes[a];

		vector<OBS_TYPE> labels;
		map<OBS_TYPE, VNode*>& vnodes = qnode->children();
		for (map<OBS_TYPE, VNode*>::iterator it = vnodes.begin();
			it != vnodes.end(); it++) {
			labels.push_back(it->first);
		}

		os << repeat("|   ", this->depth()) << "a="
			<< qnode->edge() << ": "
			<< "(d:" << qnode->default_value << ", l:" << qnode->lower_bound()
			<< ", u:" << qnode->upper_bound()
			<< ", r:" << qnode->step_reward << ")" << endl;

		for (int i = 0; i < labels.size(); i++) {
			if (depth == -1 || this->depth() + 1 <= depth) {
				os << repeat("|   ", this->depth()) << "| o=" << labels[i]
					<< ": ";
				qnode->Child(labels[i])->PrintTree(depth, os);
			}
		}
	}
}